

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O3

void __thiscall QFileSystemEntry::resolveFilePath(QFileSystemEntry *this)

{
  QString *this_00;
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_50;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_filePath).d.size == 0) &&
     (this_00 = (QString *)(this->m_nativeFilePath).d.size, this_00 != (QString *)0x0)) {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)(this->m_nativeFilePath).d.ptr;
    QString::fromLocal8Bit(&local_50,this_00,ba);
    QDir::fromNativeSeparators(&local_50);
    data = &((this->m_filePath).d.d)->super_QArrayData;
    pcVar1 = (this->m_filePath).d.ptr;
    (this->m_filePath).d.d = (Data *)local_38;
    (this->m_filePath).d.ptr = pcStack_30;
    qVar2 = (this->m_filePath).d.size;
    (this->m_filePath).d.size = local_28;
    local_38 = data;
    pcStack_30 = pcVar1;
    local_28 = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemEntry::resolveFilePath() const
{
    if (m_filePath.isEmpty() && !m_nativeFilePath.isEmpty()) {
#ifdef Q_OS_WIN
        m_filePath = QDir::fromNativeSeparators(m_nativeFilePath);
#else
        m_filePath = QDir::fromNativeSeparators(QFile::decodeName(m_nativeFilePath));
#endif
    }
}